

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitRefAs(BinaryInstWriter *this,RefAs *curr)

{
  RefAsOp RVar1;
  BufferWithRandomAccess *pBVar2;
  U32LEB local_20;
  U32LEB local_1c;
  RefAs *local_18;
  RefAs *curr_local;
  BinaryInstWriter *this_local;
  
  RVar1 = curr->op;
  local_18 = curr;
  curr_local = (RefAs *)this;
  if (RVar1 == RefAsNonNull) {
    BufferWithRandomAccess::operator<<(this->o,-0x2c);
  }
  else if (RVar1 == AnyConvertExtern) {
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,-5);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0x1a);
    BufferWithRandomAccess::operator<<(pBVar2,local_1c);
  }
  else {
    if (RVar1 != ExternConvertAny) {
      handle_unreachable("invalid ref.as_*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x9e1);
    }
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,-5);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0x1b);
    BufferWithRandomAccess::operator<<(pBVar2,local_20);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitRefAs(RefAs* curr) {
  switch (curr->op) {
    case RefAsNonNull:
      o << int8_t(BinaryConsts::RefAsNonNull);
      break;
    case AnyConvertExtern:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::AnyConvertExtern);
      break;
    case ExternConvertAny:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::ExternConvertAny);
      break;
    default:
      WASM_UNREACHABLE("invalid ref.as_*");
  }
}